

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
FIX::Session::generateBusinessReject(Session *this,Message *message,int err,int field)

{
  char *__s;
  undefined4 field_00;
  bool bVar1;
  FieldMap *pFVar2;
  Header *header;
  StringField *this_00;
  string *psVar3;
  uint64_t value;
  unsigned_long value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator<char> local_399;
  string local_398;
  char *local_378;
  char *reason;
  FieldBase local_318;
  FieldBase local_2c0;
  FieldBase local_268;
  FieldBase *local_210;
  MsgSeqNum *msgSeqNum;
  allocator<char> local_1f1;
  STRING local_1f0;
  MsgType local_1d0;
  undefined1 local_178 [8];
  Message reject;
  int field_local;
  int err_local;
  Message *message_local;
  Session *this_local;
  
  reject._336_4_ = field;
  reject.m_tag = err;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"j",&local_1f1);
  MsgType::MsgType(&local_1d0,&local_1f0);
  newMessage((Message *)local_178,this,&local_1d0);
  MsgType::~MsgType(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  pFVar2 = &Message::getHeader(message)->super_FieldMap;
  local_210 = (FieldBase *)FieldMap::getField<FIX::MsgSeqNum>(pFVar2);
  bVar1 = SessionID::isFIXT(&this->m_sessionID);
  if (bVar1) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)&local_268,&this->m_senderDefaultApplVerID);
    FieldMap::setField((FieldMap *)local_178,&local_268,true);
    DefaultApplVerID::~DefaultApplVerID((DefaultApplVerID *)&local_268);
  }
  header = Message::getHeader((Message *)local_178);
  fill(this,header);
  pFVar2 = &Message::getHeader(message)->super_FieldMap;
  this_00 = &FieldMap::getField<FIX::MsgType>(pFVar2)->super_StringField;
  psVar3 = StringField::operator_cast_to_string_(this_00);
  RefMsgType::RefMsgType((RefMsgType *)&local_2c0,psVar3);
  FieldMap::setField((FieldMap *)local_178,&local_2c0,true);
  RefMsgType::~RefMsgType((RefMsgType *)&local_2c0);
  value = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_210);
  RefSeqNum::RefSeqNum((RefSeqNum *)&local_318,value);
  FieldMap::setField((FieldMap *)local_178,&local_318,true);
  RefSeqNum::~RefSeqNum((RefSeqNum *)&local_318);
  BusinessRejectReason::BusinessRejectReason((BusinessRejectReason *)&reason,reject.m_tag);
  FieldMap::setField((FieldMap *)local_178,(FieldBase *)&reason,true);
  BusinessRejectReason::~BusinessRejectReason((BusinessRejectReason *)&reason);
  SessionState::incrNextTargetMsgSeqNum(&this->m_state);
  field_00 = reject._336_4_;
  local_378 = (char *)0x0;
  switch(reject.m_tag) {
  case 0:
    local_378 = "Other";
    break;
  case 1:
    local_378 = "Unknown ID";
    break;
  case 2:
    local_378 = "Unknown Security";
    break;
  case 3:
    local_378 = "Unsupported Message Type";
    break;
  case 4:
    local_378 = "Application Not Available";
    break;
  case 5:
    local_378 = "Conditionally Required Field Missing";
    break;
  case 6:
    local_378 = "Not Authorized";
    break;
  case 7:
    local_378 = "Deliver to firm not available at this time";
  }
  __s = local_378;
  if ((local_378 == (char *)0x0) || (reject._336_4_ == 0)) {
    if (local_378 == (char *)0x0) {
      psVar3 = FieldBase::getString_abi_cxx11_(local_210);
      std::operator+(&local_528,"Message ",psVar3);
      std::operator+(&local_508,&local_528," Rejected");
      SessionState::onEvent(&this->m_state,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,__s,&local_481);
      populateRejectReason(this,(Message *)local_178,&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
      psVar3 = FieldBase::getString_abi_cxx11_(local_210);
      std::operator+(&local_4e8,"Message ",psVar3);
      std::operator+(&local_4c8,&local_4e8," Rejected: ");
      std::operator+(&local_4a8,&local_4c8,local_378);
      SessionState::onEvent(&this->m_state,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,__s,&local_399);
    populateRejectReason(this,(Message *)local_178,field_00,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    psVar3 = FieldBase::getString_abi_cxx11_(local_210);
    std::operator+(&local_440,"Message ",psVar3);
    std::operator+(&local_420,&local_440," Rejected: ");
    std::operator+(&local_400,&local_420,local_378);
    std::operator+(&local_3e0,&local_400,":");
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_460,(IntTConvertor<unsigned_long> *)(long)(int)reject._336_4_,value_00);
    std::operator+(&local_3c0,&local_3e0,&local_460);
    SessionState::onEvent(&this->m_state,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
  }
  sendRaw(this,(Message *)local_178,0);
  Message::~Message((Message *)local_178);
  return;
}

Assistant:

void Session::generateBusinessReject(const Message &message, int err, int field) {
  Message reject = newMessage(MsgType(MsgType_BusinessMessageReject));
  auto const &msgSeqNum = message.getHeader().getField<MsgSeqNum>();

  if (m_sessionID.isFIXT()) {
    reject.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  fill(reject.getHeader());
  reject.setField(RefMsgType(message.getHeader().getField<MsgType>()));
  reject.setField(RefSeqNum(msgSeqNum));
  reject.setField(BusinessRejectReason(err));
  m_state.incrNextTargetMsgSeqNum();

  const char *reason = 0;
  switch (err) {
  case BusinessRejectReason_OTHER:
    reason = BusinessRejectReason_OTHER_TEXT;
    break;
  case BusinessRejectReason_UNKNOWN_ID:
    reason = BusinessRejectReason_UNKNOWN_ID_TEXT;
    break;
  case BusinessRejectReason_UNKNOWN_SECURITY:
    reason = BusinessRejectReason_UNKNOWN_SECURITY_TEXT;
    break;
  case BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE:
    reason = BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE_TEXT;
    break;
  case BusinessRejectReason_APPLICATION_NOT_AVAILABLE:
    reason = BusinessRejectReason_APPLICATION_NOT_AVAILABLE_TEXT;
    break;
  case BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING:
    reason = BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING_TEXT;
    break;
  case BusinessRejectReason_NOT_AUTHORIZED:
    reason = BusinessRejectReason_NOT_AUTHORIZED_TEXT;
    break;
  case BusinessRejectReason_DELIVER_TO_FIRM_NOT_AVAILABLE_AT_THIS_TIME:
    reason = BusinessRejectReason_DELIVER_TO_FIRM_NOT_AVAILABLE_AT_THIS_TIME_TEXT;
    break;
  };

  if (reason && field) {
    populateRejectReason(reject, field, reason);
    m_state.onEvent(
        "Message " + msgSeqNum.getString() + " Rejected: " + reason + ":" + SEQNUM_CONVERTOR::convert(field));
  } else if (reason) {
    populateRejectReason(reject, reason);
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected: " + reason);
  } else {
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected");
  }

  sendRaw(reject);
}